

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

bool kratos::MultipleDriverVisitor::has_for_loop(Stmt *stmt)

{
  StatementType SVar1;
  int iVar2;
  undefined4 extraout_var;
  
  while (SVar1 = stmt->type_, SVar1 != For) {
    iVar2 = (*(stmt->super_IRNode)._vptr_IRNode[4])(stmt);
    stmt = (Stmt *)CONCAT44(extraout_var,iVar2);
    if ((stmt == (Stmt *)0x0) || ((stmt->super_IRNode).ast_node_type_ != StmtKind)) break;
  }
  return SVar1 == For;
}

Assistant:

static bool has_for_loop(Stmt* stmt) {
        if (stmt->type() == StatementType::For) {
            return true;
        } else {
            auto* p = stmt->parent();
            if (p && p->ir_node_kind() == IRNodeKind::StmtKind) {
                return has_for_loop(reinterpret_cast<Stmt*>(p));
            }
        }
        return false;
    }